

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetTextMask(ON_Annotation *this,ON_DimStyle *parent_style,ON_TextMask *mask)

{
  bool value;
  MaskType value_00;
  MaskFrame value_01;
  ON_Color value_02;
  double value_03;
  undefined1 local_48 [8];
  ON_TextMask local_mask;
  ON_TextMask *mask_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  local_mask.m_content_hash.m_digest._12_8_ = mask;
  memcpy(local_48,mask,0x28);
  value = ON_TextMask::DrawTextMask((ON_TextMask *)local_48);
  SetDrawTextMask(this,parent_style,value);
  value_02 = ON_TextMask::MaskColor((ON_TextMask *)local_48);
  SetMaskColor(this,parent_style,value_02);
  value_00 = ON_TextMask::MaskFillType((ON_TextMask *)local_48);
  SetMaskFillType(this,parent_style,value_00);
  value_03 = ON_TextMask::MaskBorder((ON_TextMask *)local_48);
  SetMaskBorder(this,parent_style,value_03);
  value_01 = ON_TextMask::MaskFrameType((ON_TextMask *)local_48);
  SetMaskFrameType(this,parent_style,value_01);
  return;
}

Assistant:

void ON_Annotation::SetTextMask(const ON_DimStyle* parent_style, const ON_TextMask& mask)
{
  // In order for overrides to work correctly, each text mask property must be
  // set individually.
  const ON_TextMask local_mask(mask);
  SetDrawTextMask(parent_style, local_mask.DrawTextMask());
  SetMaskColor(parent_style, local_mask.MaskColor());
  SetMaskFillType(parent_style, local_mask.MaskFillType());
  SetMaskBorder(parent_style, local_mask.MaskBorder());
  SetMaskFrameType(parent_style, local_mask.MaskFrameType());
}